

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

string * __thiscall arangodb::velocypack::Builder::toString_abi_cxx11_(Builder *this)

{
  Slice slice;
  Options *in_RSI;
  string *in_RDI;
  StringSink sink;
  Options opts;
  string *buffer;
  Builder *in_stack_ffffffffffffff68;
  Options *in_stack_ffffffffffffff70;
  string *sink_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  
  sink_00 = in_RDI;
  Options::Options(in_stack_ffffffffffffff70);
  std::__cxx11::string::string(in_stack_ffffffffffffff90);
  StringSinkImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StringSinkImpl((StringSinkImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff68);
  slice = Builder::slice(in_stack_ffffffffffffff68);
  Dumper::dump(slice,(Sink *)sink_00,in_RSI);
  return in_RDI;
}

Assistant:

std::string Builder::toString() const {
  Options opts;
  opts.prettyPrint = true;

  std::string buffer;
  StringSink sink(&buffer);
  Dumper::dump(slice(), &sink, &opts);
  return buffer;
}